

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

Torsion * __thiscall
OpenMD::MoleculeCreator::createTorsion
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,TorsionStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom4;
  _Alloc_hider _Var2;
  int iVar3;
  TorsionType *pTVar4;
  DirectionalAtom *ghostAtom;
  Torsion *this_00;
  uint base;
  Atom *atom3;
  string s;
  allocator<char> local_129;
  Atom *local_128;
  Atom *local_120;
  string local_118;
  string local_f8;
  string local_d8;
  pointer local_b8;
  vector<int,_std::allocator<int>_> torsionAtoms;
  _Vector_base<double,_std::allocator<double>_> local_98;
  _Vector_base<double,_std::allocator<double>_> local_80;
  TorsionTypeParser ttParser;
  
  TorsionTypeParser::TorsionTypeParser(&ttParser);
  std::vector<int,_std::allocator<int>_>::vector(&torsionAtoms,&stamp->members_);
  if ((ulong)((long)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) < 9) {
    this_00 = (Torsion *)0x0;
    goto LAB_001678dc;
  }
  ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_120 = ppAVar1[(uint)*torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start];
  local_128 = ppAVar1[(uint)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[1]];
  atom3 = ppAVar1[(uint)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[2]];
  if ((long)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    atom4 = ppAVar1[(uint)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[3]];
    if (stamp->hasOverride_ == true) {
      std::__cxx11::string::string((string *)&s,(string *)&stamp->orType_);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_80,&stamp->orPars_);
      pTVar4 = TorsionTypeParser::parseTypeAndPars
                         (&ttParser,&s,(vector<double,_std::allocator<double>_> *)&local_80);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      (*(local_120->super_StuntDouble)._vptr_StuntDouble[7])(&s);
      (*(local_128->super_StuntDouble)._vptr_StuntDouble[7])(&local_118);
      (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_f8,atom3);
      (*(atom4->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom4);
      pTVar4 = ForceField::getTorsionType(ff,&s,&local_118,&local_f8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&s);
      if (pTVar4 == (TorsionType *)0x0) {
        (*(local_120->super_StuntDouble)._vptr_StuntDouble[7])(&s);
        _Var2 = s._M_dataplus;
        (*(local_128->super_StuntDouble)._vptr_StuntDouble[7])(&local_118);
        (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_f8,atom3);
        local_b8 = local_f8._M_dataplus._M_p;
        (*(atom4->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom4);
        pTVar4 = (TorsionType *)0x0;
        snprintf(painCave.errMsg,2000,"Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                 _Var2._M_p,local_118._M_dataplus._M_p,local_b8,local_d8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&s);
        painCave.isFatal = 1;
        simError();
      }
    }
    this_00 = (Torsion *)operator_new(0x98);
    Torsion::Torsion(this_00,local_120,local_128,atom3,atom4,pTVar4);
    base = (uint)atom3;
  }
  else {
    if (ppAVar1[*(uint *)&(stamp->GhostVectorSource).super_ParameterBase.field_0x2c] == (Atom *)0x0)
    {
LAB_00167484:
      builtin_strncpy(painCave.errMsg,"Can not cast Atom to DirectionalAtom",0x25);
      painCave.isFatal = 1;
      simError();
      ghostAtom = (DirectionalAtom *)0x0;
    }
    else {
      ghostAtom = (DirectionalAtom *)
                  __dynamic_cast(ppAVar1[*(uint *)&(stamp->GhostVectorSource).super_ParameterBase.
                                                   field_0x2c],&Atom::typeinfo,
                                 &DirectionalAtom::typeinfo,0);
      if (ghostAtom == (DirectionalAtom *)0x0) goto LAB_00167484;
    }
    if (stamp->hasOverride_ == true) {
      std::__cxx11::string::string((string *)&s,(string *)&stamp->orType_);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_98,&stamp->orPars_);
      pTVar4 = TorsionTypeParser::parseTypeAndPars
                         (&ttParser,&s,(vector<double,_std::allocator<double>_> *)&local_98);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      (*(local_120->super_StuntDouble)._vptr_StuntDouble[7])(&s);
      (*(local_128->super_StuntDouble)._vptr_StuntDouble[7])(&local_118);
      (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_f8,atom3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"GHOST",&local_129);
      pTVar4 = ForceField::getTorsionType(ff,&s,&local_118,&local_f8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&s);
      if (pTVar4 == (TorsionType *)0x0) {
        (*(local_120->super_StuntDouble)._vptr_StuntDouble[7])(&s);
        _Var2 = s._M_dataplus;
        (*(local_128->super_StuntDouble)._vptr_StuntDouble[7])(&local_118);
        (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_f8,atom3);
        pTVar4 = (TorsionType *)0x0;
        snprintf(painCave.errMsg,2000,"Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                 _Var2._M_p,local_118._M_dataplus._M_p,local_f8._M_dataplus._M_p,"GHOST");
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&s);
        painCave.isFatal = 1;
        simError();
      }
    }
    this_00 = (Torsion *)operator_new(0x98);
    GhostTorsion::GhostTorsion((GhostTorsion *)this_00,local_120,local_128,ghostAtom,pTVar4);
    base = (uint)ghostAtom;
  }
  iVar3 = IndexListContainer::pop(&localIndexMan->torsionIndexContainer_);
  (this_00->super_ShortRangeInteraction).localIndex_ = iVar3;
  OpenMD_itoa_abi_cxx11_
            (&s,(OpenMD *)
                ((ulong)((long)(mol->torsions_).
                               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(mol->torsions_).
                              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3),10,base);
  Molecule::getType_abi_cxx11_(&local_d8,mol);
  std::operator+(&local_f8,&local_d8,"_Torsion_");
  std::operator+(&local_118,&local_f8,s._M_dataplus._M_p);
  (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&s);
LAB_001678dc:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
               *)&ttParser);
  return this_00;
}

Assistant:

Torsion* MoleculeCreator::createTorsion(ForceField* ff, Molecule* mol,
                                          TorsionStamp* stamp,
                                          LocalIndexManager* localIndexMan) {
    TorsionTypeParser ttParser;
    TorsionType* torsionType = NULL;
    Torsion* torsion         = NULL;

    std::vector<int> torsionAtoms = stamp->getMembers();
    if (torsionAtoms.size() < 3) { return torsion; }

    Atom* atomA = mol->getAtomAt(torsionAtoms[0]);
    Atom* atomB = mol->getAtomAt(torsionAtoms[1]);
    Atom* atomC = mol->getAtomAt(torsionAtoms[2]);

    if (torsionAtoms.size() == 4) {
      Atom* atomD = mol->getAtomAt(torsionAtoms[3]);

      assert(atomA && atomB && atomC && atomD);

      if (stamp->hasOverride()) {
        try {
          torsionType = ttParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        torsionType = ff->getTorsionType(atomA->getType(), atomB->getType(),
                                         atomC->getType(), atomD->getType());
        if (torsionType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str(), atomD->getType().c_str());

          painCave.isFatal = 1;
          simError();
        }
      }

      torsion = new Torsion(atomA, atomB, atomC, atomD, torsionType);
    } else {
      DirectionalAtom* dAtom = dynamic_cast<DirectionalAtom*>(
          mol->getAtomAt(stamp->getGhostVectorSource()));
      if (dAtom == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }

      if (stamp->hasOverride()) {
        try {
          torsionType = ttParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        torsionType = ff->getTorsionType(atomA->getType(), atomB->getType(),
                                         atomC->getType(), "GHOST");

        if (torsionType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str(), "GHOST");

          painCave.isFatal = 1;
          simError();
        }
      }

      torsion = new GhostTorsion(atomA, atomB, dAtom, torsionType);
    }

    // set the local index of this torsion, the global index will be set later
    torsion->setLocalIndex(localIndexMan->getNextTorsionIndex());

    // The rule for naming a torsion is: MoleculeName_Torsion_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Torsion"
    // The third part is the index of the torsion defined in meta-data file
    // For example, Butane_Torsion_0 is a valid Torsion name in a
    // butane molecule

    std::string s = OpenMD_itoa(mol->getNTorsions(), 10);
    torsion->setName(mol->getType() + "_Torsion_" + s.c_str());
    return torsion;
  }